

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magics.cpp
# Opt level: O1

U64 magics::attacks<(Piece)2>(Square *s,U64 *block)

{
  Square SVar1;
  void *pvVar2;
  int *piVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  U64 UVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_01;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  steps;
  allocator_type local_c3;
  allocator_type local_c2;
  allocator_type local_c1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_c0;
  vector<int,_std::allocator<int>_> local_a8;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  int local_48 [8];
  
  local_88 = 0;
  uStack_80 = 0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uStack_90 = 0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48[4] = -7;
  local_48[5] = 7;
  local_48[6] = -9;
  local_48[7] = 9;
  __l._M_len = 4;
  __l._M_array = local_48 + 4;
  std::vector<int,_std::allocator<int>_>::vector(&local_78,__l,&local_c1);
  local_48[0] = -1;
  local_48[1] = 1;
  local_48[2] = -8;
  local_48[3] = 8;
  __l_00._M_len = 4;
  __l_00._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l_00,&local_c2);
  __l_01._M_len = 4;
  __l_01._M_array = &local_a8;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_c0,__l_01,&local_c3);
  lVar6 = 0x60;
  do {
    pvVar2 = *(void **)((long)&local_c0.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar6);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)&local_c0.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar6) - (long)pvVar2);
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != 0);
  piVar5 = local_c0.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar3 = local_c0.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (piVar5 == piVar3) {
    UVar7 = 0;
  }
  else {
    SVar1 = *s;
    UVar7 = 0;
    do {
      uVar9 = 0;
      uVar11 = 1;
      uVar8 = (long)(int)SVar1;
      do {
        uVar8 = uVar8 + (long)*piVar5;
        if (uVar8 < 0x40) {
          iVar12 = (SVar1 & H1) - ((uint)uVar8 & 7);
          iVar4 = -iVar12;
          if (0 < iVar12) {
            iVar4 = iVar12;
          }
          iVar10 = ((int)SVar1 >> 3) - ((uint)(uVar8 >> 3) & 0x1fffffff);
          iVar12 = -iVar10;
          if (0 < iVar10) {
            iVar12 = iVar10;
          }
          if (iVar4 == iVar12) {
            uVar9 = uVar9 | 1L << (uVar8 & 0x3f);
          }
        }
      } while (((*block & uVar9) == 0) && (bVar13 = uVar11 < 7, uVar11 = uVar11 + 1, bVar13));
      UVar7 = UVar7 | uVar9;
      piVar5 = piVar5 + 1;
    } while (piVar5 != piVar3);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_c0);
  return UVar7;
}

Assistant:

U64 magics::attacks(const Square& s, const U64& block) {
	std::vector< std::vector<int> > steps =
	{ {}, // pawn
		{}, // knight
		{-7, 7, -9, 9}, // bishop
		{-1, 1, -8, 8}  // rook
	};
	U64 bm = 0ULL;
	for (auto& step : steps[p]) {
		U64 tmp = 0ULL;
		int sqs = 1;

		while ((tmp & block) == 0ULL && sqs < 8) {
			int to = s + (sqs++) * step;
			if (util::on_board(to) &&
				util::col_dist(s, to) <= 7 &&
				util::row_dist(s, to) <= 7 &&
				((p == Piece::bishop && util::on_diagonal(s, to)) ||
					(p == Piece::rook && (util::same_row(s, to) || util::same_col(s, to))))) {
				tmp |= (1ULL << to);
			}
		}
		bm |= tmp;
	}
	return bm;
}